

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

void __thiscall
stick::String::append<char_const*,stick::String>(String *this,char *param_2,String *param_3)

{
  size_t sVar1;
  long lVar2;
  Size local_30;
  Size off;
  
  sVar1 = strlen(param_2);
  lVar2 = sVar1 + param_3->m_length;
  if (lVar2 != 0) {
    local_30 = this->m_length;
    preAppend(this,lVar2 + local_30);
    detail::_StringCopier::performCopy(this,&local_30,param_2);
    detail::_StringCopier::performCopy(this,&local_30,param_3);
  }
  return;
}

Assistant:

inline void String::append(AppendVariadicFlag _flag, Strings... _args)
{
    Size len = 0;
    int unpack[]{ 0, (len += detail::_StringCopier::strLen(_args), 0)... };
    STICK_UNUSED(unpack);
    if (!len)
        return;
    Size off = m_length;
    preAppend(m_length + len);
    int unpack2[]{ 0, (detail::_StringCopier::performCopy(*this, off, _args))... };
    STICK_UNUSED(unpack2);
}